

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_xml.cpp
# Opt level: O2

Language * Omega_h::xml::build_language(void)

{
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *this;
  Language *in_RDI;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_24;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_25;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_27;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_28;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_29;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_31;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_32;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_33;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_34;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_35;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_36;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_37;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_38;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_39;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_40;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_41;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_42;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_43;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_44;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_45;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_46;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_47;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_48;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_49;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_50;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_51;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_52;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_53;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_54;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_55;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_56;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_57;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_58;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_59;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_60;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_61;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_62;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_63;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_64;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_65;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_66;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_67;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_68;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_69;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_70;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_71;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_72;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_73;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_74;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_75;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_76;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_77;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_78;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_79;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_80;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_81;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_82;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_83;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_84;
  allocator local_175;
  allocator_type local_174;
  allocator local_173;
  allocator local_172;
  allocator_type local_171;
  Production local_170;
  allocator local_133;
  allocator local_132;
  allocator_type local_131;
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [38];
  allocator_type local_2a;
  allocator local_29;
  
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this = &in_RDI->productions;
  std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::resize
            (this,0x60);
  std::__cxx11::string::string((string *)local_130,"document",&local_175);
  std::__cxx11::string::string((string *)&local_170,"toplevels",&local_173);
  __l._M_len = 1;
  __l._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"toplevels",(allocator *)&local_170);
  local_110._16_8_ = (pointer)0x0;
  local_110._0_8_ = (pointer)0x0;
  local_110._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::string((string *)&local_170,"toplevels",&local_175);
  std::__cxx11::string::string((string *)local_130,"toplevel",&local_173);
  std::__cxx11::string::string((string *)local_110,"S?",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"toplevels",&local_172);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_00,&local_171);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 2,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"toplevel",&local_175);
  std::__cxx11::string::string((string *)&local_170,"element",&local_173);
  __l_01._M_len = 1;
  __l_01._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_01,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 3,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"toplevel",&local_175);
  std::__cxx11::string::string((string *)&local_170,"XMLDecl",&local_173);
  __l_02._M_len = 1;
  __l_02._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_02,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 4,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"element",&local_175);
  std::__cxx11::string::string((string *)&local_170,"EmptyElemTag",&local_173);
  __l_03._M_len = 1;
  __l_03._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_03,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 5,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_170,"element",&local_175);
  std::__cxx11::string::string((string *)local_130,"STag",&local_173);
  std::__cxx11::string::string((string *)local_110,"content",(allocator *)&local_174);
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_04,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 6,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"XMLDecl",&local_175);
  std::__cxx11::string::string((string *)local_130,"<",&local_173);
  std::__cxx11::string::string((string *)local_110,"?",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"Name",&local_172);
  std::__cxx11::string::string(local_d0,"TagFill",(allocator *)&local_171);
  std::__cxx11::string::string(local_b0,"?",&local_133);
  std::__cxx11::string::string(local_90,">",&local_132);
  __l_05._M_len = 6;
  __l_05._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_05,&local_131);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 7,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"STag",&local_175);
  std::__cxx11::string::string((string *)local_130,"<",&local_173);
  std::__cxx11::string::string((string *)local_110,"Name",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"TagFill",&local_172);
  std::__cxx11::string::string(local_d0,">",(allocator *)&local_171);
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_06,(allocator_type *)&local_133);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 8,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"ETag",&local_175);
  std::__cxx11::string::string((string *)local_130,"<",&local_173);
  std::__cxx11::string::string((string *)local_110,"/",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"Name",&local_172);
  std::__cxx11::string::string(local_d0,"S?",(allocator *)&local_171);
  std::__cxx11::string::string(local_b0,">",&local_133);
  __l_07._M_len = 5;
  __l_07._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_07,(allocator_type *)&local_132);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 9,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"EmptyElemTag",&local_175);
  std::__cxx11::string::string((string *)local_130,"<",&local_173);
  std::__cxx11::string::string((string *)local_110,"Name",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"TagFill",&local_172);
  std::__cxx11::string::string(local_d0,"/",(allocator *)&local_171);
  std::__cxx11::string::string(local_b0,">",&local_133);
  __l_08._M_len = 5;
  __l_08._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_08,(allocator_type *)&local_132);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 10,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"content",&local_175);
  std::__cxx11::string::string((string *)local_130,"CharData?",&local_173);
  std::__cxx11::string::string((string *)local_110,"ContentItem*",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"ETag",&local_172);
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_09,&local_171);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xb,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"ContentItem*",(allocator *)&local_170);
  local_110._16_8_ = (pointer)0x0;
  local_110._0_8_ = (pointer)0x0;
  local_110._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xc,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::string((string *)&local_170,"ContentItem*",&local_175);
  std::__cxx11::string::string((string *)local_130,"ContentItem*",&local_173);
  std::__cxx11::string::string((string *)local_110,"ContentItem",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"CharData?",&local_172);
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_10,&local_171);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xd,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"ContentItem",&local_175);
  std::__cxx11::string::string((string *)&local_170,"element",&local_173);
  __l_11._M_len = 1;
  __l_11._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_11,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xe,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"ContentItem",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Reference",&local_173);
  __l_12._M_len = 1;
  __l_12._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_12,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xf,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"ContentItem",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Comment",&local_173);
  __l_13._M_len = 1;
  __l_13._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_13,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x10,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CharData?",(allocator *)&local_170);
  local_110._16_8_ = (pointer)0x0;
  local_110._0_8_ = (pointer)0x0;
  local_110._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x11,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::string((string *)&local_170,"CharData?",&local_175);
  std::__cxx11::string::string((string *)local_130,"CharData?",&local_173);
  std::__cxx11::string::string((string *)local_110,"DataChar",(allocator *)&local_174);
  __l_14._M_len = 2;
  __l_14._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_14,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x12,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"TagFill",&local_175);
  std::__cxx11::string::string((string *)local_130,"Attributes",&local_173);
  std::__cxx11::string::string((string *)local_110,"S?",(allocator *)&local_174);
  __l_15._M_len = 2;
  __l_15._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_15,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x13,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"Attributes",(allocator *)&local_170);
  local_110._16_8_ = (pointer)0x0;
  local_110._0_8_ = (pointer)0x0;
  local_110._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x14,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::string((string *)&local_170,"Attributes",&local_175);
  std::__cxx11::string::string((string *)local_130,"Attributes",&local_173);
  std::__cxx11::string::string((string *)local_110,"S",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"Attribute",&local_172);
  __l_16._M_len = 3;
  __l_16._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_16,&local_171);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x15,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"Attribute",&local_175);
  std::__cxx11::string::string((string *)local_130,"Name",&local_173);
  std::__cxx11::string::string((string *)local_110,"Eq",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"AttValue",&local_172);
  __l_17._M_len = 3;
  __l_17._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_17,&local_171);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x16,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"Eq",&local_175);
  std::__cxx11::string::string((string *)local_130,"S?",&local_173);
  std::__cxx11::string::string((string *)local_110,"=",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"S?",&local_172);
  __l_18._M_len = 3;
  __l_18._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_18,&local_171);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x17,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"AttValue",&local_175);
  std::__cxx11::string::string((string *)local_130,"\"",&local_173);
  std::__cxx11::string::string((string *)local_110,"DQuoteds",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"\"",&local_172);
  __l_19._M_len = 3;
  __l_19._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_19,&local_171);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x18,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"AttValue",&local_175);
  std::__cxx11::string::string((string *)local_130,"\'",&local_173);
  std::__cxx11::string::string((string *)local_110,"SQuoteds",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"\'",&local_172);
  __l_20._M_len = 3;
  __l_20._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_20,&local_171);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x19,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"DQuoteds",(allocator *)&local_170);
  local_110._16_8_ = (pointer)0x0;
  local_110._0_8_ = (pointer)0x0;
  local_110._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1a,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::string((string *)&local_170,"DQuoteds",&local_175);
  std::__cxx11::string::string((string *)local_130,"DQuoteds",&local_173);
  std::__cxx11::string::string((string *)local_110,"DQuoted",(allocator *)&local_174);
  __l_21._M_len = 2;
  __l_21._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_21,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1b,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"DQuoted",&local_175);
  std::__cxx11::string::string((string *)&local_170,"DQuotedChar",&local_173);
  __l_22._M_len = 1;
  __l_22._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_22,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1c,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"DQuoted",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Reference",&local_173);
  __l_23._M_len = 1;
  __l_23._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_23,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1d,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"SQuoteds",(allocator *)&local_170);
  local_110._16_8_ = (pointer)0x0;
  local_110._0_8_ = (pointer)0x0;
  local_110._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1e,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::string((string *)&local_170,"SQuoteds",&local_175);
  std::__cxx11::string::string((string *)local_130,"SQuoteds",&local_173);
  std::__cxx11::string::string((string *)local_110,"SQuoted",(allocator *)&local_174);
  __l_24._M_len = 2;
  __l_24._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_24,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1f,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"SQuoted",&local_175);
  std::__cxx11::string::string((string *)&local_170,"SQuotedChar",&local_173);
  __l_25._M_len = 1;
  __l_25._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_25,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x20,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"SQuoted",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Reference",&local_173);
  __l_26._M_len = 1;
  __l_26._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_26,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x21,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_170,"Name",&local_175);
  std::__cxx11::string::string((string *)local_130,"NameFirstChar",&local_173);
  std::__cxx11::string::string((string *)local_110,"NameChars",(allocator *)&local_174);
  __l_27._M_len = 2;
  __l_27._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_27,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x22,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"NameFirstChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Letter",&local_173);
  __l_28._M_len = 1;
  __l_28._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_28,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x23,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"NameFirstChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"_",&local_173);
  __l_29._M_len = 1;
  __l_29._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_29,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x24,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"NameFirstChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,":",&local_173);
  __l_30._M_len = 1;
  __l_30._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_30,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x25,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"NameChars",(allocator *)&local_170);
  local_110._16_8_ = (pointer)0x0;
  local_110._0_8_ = (pointer)0x0;
  local_110._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x26,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::string((string *)&local_170,"NameChars",&local_175);
  std::__cxx11::string::string((string *)local_130,"NameChars",&local_173);
  std::__cxx11::string::string((string *)local_110,"NameChar",(allocator *)&local_174);
  __l_31._M_len = 2;
  __l_31._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_31,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x27,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"NameChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Letter",&local_173);
  __l_32._M_len = 1;
  __l_32._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_32,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x28,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"NameChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Digit",&local_173);
  __l_33._M_len = 1;
  __l_33._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_33,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x29,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"NameChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,".",&local_173);
  __l_34._M_len = 1;
  __l_34._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_34,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2a,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"NameChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"-",&local_173);
  __l_35._M_len = 1;
  __l_35._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_35,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2b,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"NameChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"_",&local_173);
  __l_36._M_len = 1;
  __l_36._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_36,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2c,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"NameChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,":",&local_173);
  __l_37._M_len = 1;
  __l_37._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_37,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2d,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"Miscs",(allocator *)&local_170);
  local_110._16_8_ = (pointer)0x0;
  local_110._0_8_ = (pointer)0x0;
  local_110._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2e,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::string((string *)&local_170,"Miscs",&local_175);
  std::__cxx11::string::string((string *)local_130,"Miscs",&local_173);
  std::__cxx11::string::string((string *)local_110,"Misc",(allocator *)&local_174);
  __l_38._M_len = 2;
  __l_38._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_38,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2f,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"Misc",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Comment",&local_173);
  __l_39._M_len = 1;
  __l_39._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_39,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x30,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"Misc",&local_175);
  std::__cxx11::string::string((string *)&local_170,"S",&local_173);
  __l_40._M_len = 1;
  __l_40._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_40,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x31,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_170,"Comment",&local_175);
  std::__cxx11::string::string((string *)local_130,"<",&local_173);
  std::__cxx11::string::string((string *)local_110,"!",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"-",&local_172);
  std::__cxx11::string::string(local_d0,"-",(allocator *)&local_171);
  std::__cxx11::string::string(local_b0,"Commenteds",&local_133);
  std::__cxx11::string::string(local_90,"-",&local_132);
  std::__cxx11::string::string(local_70,"-",(allocator *)&local_131);
  std::__cxx11::string::string(local_50,">",&local_29);
  __l_41._M_len = 8;
  __l_41._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_41,&local_2a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x32,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"Commenteds",(allocator *)&local_170);
  local_110._16_8_ = (pointer)0x0;
  local_110._0_8_ = (pointer)0x0;
  local_110._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x33,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::string((string *)&local_170,"Commenteds",&local_175);
  std::__cxx11::string::string((string *)local_130,"Commenteds",&local_173);
  std::__cxx11::string::string((string *)local_110,"Commented",(allocator *)&local_174);
  __l_42._M_len = 2;
  __l_42._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_42,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x34,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"Commented",&local_175);
  std::__cxx11::string::string((string *)&local_170,"CommentChar",&local_173);
  __l_43._M_len = 1;
  __l_43._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_43,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x35,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_170,"Commented",&local_175);
  std::__cxx11::string::string((string *)local_130,"-",&local_173);
  std::__cxx11::string::string((string *)local_110,"CommentChar",(allocator *)&local_174);
  __l_44._M_len = 2;
  __l_44._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_44,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x36,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"Reference",&local_175);
  std::__cxx11::string::string((string *)local_130,"&",&local_173);
  std::__cxx11::string::string((string *)local_110,"Name",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,";",&local_172);
  __l_45._M_len = 3;
  __l_45._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_45,&local_171);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x37,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_170,"Reference",&local_175);
  std::__cxx11::string::string((string *)local_130,"&",&local_173);
  std::__cxx11::string::string((string *)local_110,"#",(allocator *)&local_174);
  std::__cxx11::string::string(local_f0,"Digits",&local_172);
  std::__cxx11::string::string(local_d0,";",(allocator *)&local_171);
  __l_46._M_len = 4;
  __l_46._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_46,(allocator_type *)&local_133);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x38,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"Digits",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Digit",&local_173);
  __l_47._M_len = 1;
  __l_47._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_47,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x39,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_170,"Digits",&local_175);
  std::__cxx11::string::string((string *)local_130,"Digits",&local_173);
  std::__cxx11::string::string((string *)local_110,"Digit",(allocator *)&local_174);
  __l_48._M_len = 2;
  __l_48._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_48,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3a,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"S?",(allocator *)&local_170);
  local_110._16_8_ = (pointer)0x0;
  local_110._0_8_ = (pointer)0x0;
  local_110._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3b,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::string((string *)local_130,"S?",&local_175);
  std::__cxx11::string::string((string *)&local_170,"S",&local_173);
  __l_49._M_len = 1;
  __l_49._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_49,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3c,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"S",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Space",&local_173);
  __l_50._M_len = 1;
  __l_50._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_50,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3d,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_170,"S",&local_175);
  std::__cxx11::string::string((string *)local_130,"S",&local_173);
  std::__cxx11::string::string((string *)local_110,"Space",(allocator *)&local_174);
  __l_51._M_len = 2;
  __l_51._M_array = (iterator)local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170.rhs,__l_51,(allocator_type *)&local_172);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3e,&local_170);
  Language::Production::~Production(&local_170);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_130 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_130,"DQuotedChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"CommonChar",&local_173);
  __l_52._M_len = 1;
  __l_52._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_52,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3f,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"DQuotedChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"\'",&local_173);
  __l_53._M_len = 1;
  __l_53._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_53,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x40,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"DQuotedChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"]",&local_173);
  __l_54._M_len = 1;
  __l_54._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_54,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x41,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"DQuotedChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"-",&local_173);
  __l_55._M_len = 1;
  __l_55._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_55,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x42,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"SQuotedChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"CommonChar",&local_173);
  __l_56._M_len = 1;
  __l_56._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_56,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x43,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"SQuotedChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"\"",&local_173);
  __l_57._M_len = 1;
  __l_57._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_57,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x44,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"SQuotedChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"]",&local_173);
  __l_58._M_len = 1;
  __l_58._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_58,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x45,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"SQuotedChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"-",&local_173);
  __l_59._M_len = 1;
  __l_59._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_59,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x46,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"DataChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"CommonChar",&local_173);
  __l_60._M_len = 1;
  __l_60._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_60,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x47,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"DataChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"\'",&local_173);
  __l_61._M_len = 1;
  __l_61._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_61,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x48,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"DataChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"\"",&local_173);
  __l_62._M_len = 1;
  __l_62._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_62,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x49,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"DataChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"-",&local_173);
  __l_63._M_len = 1;
  __l_63._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_63,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4a,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommentChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"CommonChar",&local_173);
  __l_64._M_len = 1;
  __l_64._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_64,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4b,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommentChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"<",&local_173);
  __l_65._M_len = 1;
  __l_65._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_65,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4c,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommentChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"&",&local_173);
  __l_66._M_len = 1;
  __l_66._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_66,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4d,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommentChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"\'",&local_173);
  __l_67._M_len = 1;
  __l_67._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_67,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4e,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommentChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"\"",&local_173);
  __l_68._M_len = 1;
  __l_68._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_68,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4f,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommentChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"]",&local_173);
  __l_69._M_len = 1;
  __l_69._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_69,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x50,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Space",&local_173);
  __l_70._M_len = 1;
  __l_70._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_70,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x51,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Letter",&local_173);
  __l_71._M_len = 1;
  __l_71._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_71,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x52,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"Digit",&local_173);
  __l_72._M_len = 1;
  __l_72._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_72,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x53,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"!",&local_173);
  __l_73._M_len = 1;
  __l_73._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_73,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x54,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"#",&local_173);
  __l_74._M_len = 1;
  __l_74._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_74,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x55,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,".",&local_173);
  __l_75._M_len = 1;
  __l_75._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_75,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x56,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"/",&local_173);
  __l_76._M_len = 1;
  __l_76._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_76,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x57,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,":",&local_173);
  __l_77._M_len = 1;
  __l_77._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_77,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x58,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,";",&local_173);
  __l_78._M_len = 1;
  __l_78._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_78,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x59,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,">",&local_173);
  __l_79._M_len = 1;
  __l_79._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_79,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5a,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"?",&local_173);
  __l_80._M_len = 1;
  __l_80._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_80,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5b,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"=",&local_173);
  __l_81._M_len = 1;
  __l_81._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_81,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5c,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"[",&local_173);
  __l_82._M_len = 1;
  __l_82._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_82,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5d,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"_",&local_173);
  __l_83._M_len = 1;
  __l_83._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_83,&local_174);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5e,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)local_130,"CommonChar",&local_175);
  std::__cxx11::string::string((string *)&local_170,"OtherChar",&local_173);
  __l_84._M_len = 1;
  __l_84._M_array = &local_170.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110,__l_84,&local_174);
  Language::Production::operator=
            ((in_RDI->productions).
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x5f,(Production *)local_130);
  Language::Production::~Production((Production *)local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::resize
            (&in_RDI->tokens,0x15);
  std::__cxx11::string::string((string *)local_130,"Space",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"[ \t\r\n]",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"Letter",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"[a-zA-Z]",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"Digit",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"[0-9]",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"!",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"!",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"\"",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"\"",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"\'",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"\'",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 5,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"#",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"#",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 6,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"&",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"&",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 7,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"-",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"\\-",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,".",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"\\.",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 9,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"/",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"/",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 10,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,":",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,":",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xb,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,";",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,";",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xc,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"<",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"<",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,">",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,">",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"?",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"\\?",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xf,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"=",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"=",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x10,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"[",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"\\[",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x11,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"]",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"\\]",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x12,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"_",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"_",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x13,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  std::__cxx11::string::string((string *)local_130,"OtherChar",(allocator *)&local_170);
  std::__cxx11::string::string((string *)local_110,"[$%\\(\\)\\*\\+,@\\\\\\^`{}\\|~]",&local_175);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x14,(Token *)local_130);
  Language::Token::~Token((Token *)local_130);
  return in_RDI;
}

Assistant:

Language build_language() {
  Language out;
  auto& prods = out.productions;
  prods.resize(NPRODS);
  prods[PROD_DOC] = {"document", {"toplevels"}};
  prods[PROD_TOPLEVEL] = {"toplevels", {}};
  prods[PROD_TOPLEVELS] = {"toplevels", {"toplevel", "S?", "toplevels"}};
  prods[PROD_TOPLEVEL_ELEMENT] = {"toplevel", {"element"}};
  prods[PROD_TOPLEVEL_XMLDECL] = {"toplevel", {"XMLDecl"}};
  prods[PROD_ELEMENT_EMPTY] = {"element", {"EmptyElemTag"}};
  prods[PROD_ELEMENT] = {"element", {"STag", "content"}};
  prods[PROD_XMLDECL] = {"XMLDecl", {"<", "?", "Name", "TagFill", "?", ">"}};
  prods[PROD_STAG] = {"STag", {"<", "Name", "TagFill", ">"}};
  prods[PROD_ETAG] = {"ETag", {"<", "/", "Name", "S?", ">"}};
  prods[PROD_EMPTY_TAG] = {"EmptyElemTag", {"<", "Name", "TagFill", "/", ">"}};
  prods[PROD_CONTENT] = {"content", {"CharData?", "ContentItem*", "ETag"}};
  prods[PROD_NO_CONTENT_ITEMS] = {"ContentItem*", {}};
  prods[PROD_CONTENT_ITEMS] = {
      "ContentItem*", {"ContentItem*", "ContentItem", "CharData?"}};
  prods[PROD_CONTENT_ELEMENT] = {"ContentItem", {"element"}};
  prods[PROD_CONTENT_REF] = {"ContentItem", {"Reference"}};
  prods[PROD_CONTENT_COMMENT] = {"ContentItem", {"Comment"}};
  prods[PROD_NO_CHARDATA] = {"CharData?", {}};
  prods[PROD_CHARDATA] = {"CharData?", {"CharData?", "DataChar"}};
  prods[PROD_TAGFILL] = {"TagFill", {"Attributes", "S?"}};
  prods[PROD_NO_ATTS] = {"Attributes", {}};
  prods[PROD_ATTS] = {"Attributes", {"Attributes", "S", "Attribute"}};
  prods[PROD_ATT] = {"Attribute", {"Name", "Eq", "AttValue"}};
  prods[PROD_EQ] = {"Eq", {"S?", "=", "S?"}};
  prods[PROD_ATTVALUE_D] = {"AttValue", {"\"", "DQuoteds", "\""}};
  prods[PROD_ATTVALUE_S] = {"AttValue", {"'", "SQuoteds", "'"}};
  prods[PROD_NO_DQUOTS] = {"DQuoteds", {}};
  prods[PROD_DQUOTS] = {"DQuoteds", {"DQuoteds", "DQuoted"}};
  prods[PROD_DQUOT_CHAR] = {"DQuoted", {"DQuotedChar"}};
  prods[PROD_DQUOT_REF] = {"DQuoted", {"Reference"}};
  prods[PROD_NO_SQUOTS] = {"SQuoteds", {}};
  prods[PROD_SQUOTS] = {"SQuoteds", {"SQuoteds", "SQuoted"}};
  prods[PROD_SQUOT_CHAR] = {"SQuoted", {"SQuotedChar"}};
  prods[PROD_SQUOT_REF] = {"SQuoted", {"Reference"}};
  prods[PROD_NAME] = {"Name", {"NameFirstChar", "NameChars"}};
  prods[PROD_NAME_FIRST_LETTER] = {"NameFirstChar", {"Letter"}};
  prods[PROD_NAME_FIRST_UNDER] = {"NameFirstChar", {"_"}};
  prods[PROD_NAME_FIRST_COLON] = {"NameFirstChar", {":"}};
  prods[PROD_NO_NAME_CHARS] = {"NameChars", {}};
  prods[PROD_NAME_CHARS] = {"NameChars", {"NameChars", "NameChar"}};
  prods[PROD_NAME_LETTER] = {"NameChar", {"Letter"}};
  prods[PROD_NAME_DIGIT] = {"NameChar", {"Digit"}};
  prods[PROD_NAME_DOT] = {"NameChar", {"."}};
  prods[PROD_NAME_DASH] = {"NameChar", {"-"}};
  prods[PROD_NAME_UNDER] = {"NameChar", {"_"}};
  prods[PROD_NAME_COLON] = {"NameChar", {":"}};
  prods[PROD_NO_MISCS] = {"Miscs", {}};
  prods[PROD_MISCS] = {"Miscs", {"Miscs", "Misc"}};
  prods[PROD_MISC_COMMENT] = {"Misc", {"Comment"}};
  prods[PROD_MISC_SPACE] = {"Misc", {"S"}};
  prods[PROD_COMMENT] = {
      "Comment", {"<", "!", "-", "-", "Commenteds", "-", "-", ">"}};
  prods[PROD_NO_COMMENTED] = {"Commenteds", {}};
  prods[PROD_COMMENTED] = {"Commenteds", {"Commenteds", "Commented"}};
  prods[PROD_COMMENT_CHAR] = {"Commented", {"CommentChar"}};
  prods[PROD_COMMENT_DASH] = {"Commented", {"-", "CommentChar"}};
  prods[PROD_ENT_REF] = {"Reference", {"&", "Name", ";"}};
  prods[PROD_CHAR_REF] = {"Reference", {"&", "#", "Digits", ";"}};
  prods[PROD_ONE_DIGIT] = {"Digits", {"Digit"}};
  prods[PROD_DIGITS] = {"Digits", {"Digits", "Digit"}};
  prods[PROD_NO_SPACES] = {"S?", {}};
  prods[PROD_YES_SPACES] = {"S?", {"S"}};
  prods[PROD_ONE_SPACE] = {"S", {"Space"}};
  prods[PROD_SPACES] = {"S", {"S", "Space"}};
  prods[PROD_DQUOTED_COMMON] = {"DQuotedChar", {"CommonChar"}};
  prods[PROD_DQUOTED_SQUOT] = {"DQuotedChar", {"'"}};
  prods[PROD_DQUOTED_RSQUARE] = {"DQuotedChar", {"]"}};
  prods[PROD_DQUOTED_DASH] = {"DQuotedChar", {"-"}};
  prods[PROD_SQUOTED_CHAR] = {"SQuotedChar", {"CommonChar"}};
  prods[PROD_SQUOTED_DQUOT] = {"SQuotedChar", {"\""}};
  prods[PROD_SQUOTED_RSQUARE] = {"SQuotedChar", {"]"}};
  prods[PROD_SQUOTED_DASH] = {"SQuotedChar", {"-"}};
  prods[PROD_DATA_COMMON] = {"DataChar", {"CommonChar"}};
  prods[PROD_DATA_SQUOT] = {"DataChar", {"'"}};
  prods[PROD_DATA_DQUOT] = {"DataChar", {"\""}};
  prods[PROD_DATA_DASH] = {"DataChar", {"-"}};
  prods[PROD_COMMENT_COMMON] = {"CommentChar", {"CommonChar"}};
  prods[PROD_COMMENT_LANGLE] = {"CommentChar", {"<"}};
  prods[PROD_COMMENT_AMP] = {"CommentChar", {"&"}};
  prods[PROD_COMMENT_SQUOT] = {"CommentChar", {"'"}};
  prods[PROD_COMMENT_DQUOT] = {"CommentChar", {"\""}};
  prods[PROD_COMMENT_RSQUARE] = {"CommentChar", {"]"}};
  prods[PROD_COMMON_SPACE] = {"CommonChar", {"Space"}};
  prods[PROD_COMMON_LETTER] = {"CommonChar", {"Letter"}};
  prods[PROD_COMMON_DIGIT] = {"CommonChar", {"Digit"}};
  prods[PROD_COMMON_EXCL] = {"CommonChar", {"!"}};
  prods[PROD_COMMON_POUND] = {"CommonChar", {"#"}};
  prods[PROD_COMMON_DOT] = {"CommonChar", {"."}};
  prods[PROD_COMMON_SLASH] = {"CommonChar", {"/"}};
  prods[PROD_COMMON_COLON] = {"CommonChar", {":"}};
  prods[PROD_COMMON_SEMICOLON] = {"CommonChar", {";"}};
  prods[PROD_COMMON_RANGLE] = {"CommonChar", {">"}};
  prods[PROD_COMMON_QUESTION] = {"CommonChar", {"?"}};
  prods[PROD_COMMON_EQUAL] = {"CommonChar", {"="}};
  prods[PROD_COMMON_LSQUARE] = {"CommonChar", {"["}};
  prods[PROD_COMMON_UNDER] = {"CommonChar", {"_"}};
  prods[PROD_COMMON_OTHER] = {"CommonChar", {"OtherChar"}};
  auto& toks = out.tokens;
  toks.resize(NTOKS);
  toks[TOK_SPACE] = {"Space", "[ \t\r\n]"};
  toks[TOK_LETTER] = {"Letter", "[a-zA-Z]"};
  toks[TOK_DIGIT] = {"Digit", "[0-9]"};
  toks[TOK_EXCL] = {"!", "!"};
  toks[TOK_DQUOTE] = {"\"", "\""};
  toks[TOK_SQUOTE] = {"'", "'"};
  toks[TOK_POUND] = {"#", "#"};
  toks[TOK_AMP] = {"&", "&"};
  toks[TOK_DASH] = {"-", "\\-"};
  toks[TOK_DOT] = {".", "\\."};
  toks[TOK_SLASH] = {"/", "/"};
  toks[TOK_COLON] = {":", ":"};
  toks[TOK_SEMICOLON] = {";", ";"};
  toks[TOK_LANGLE] = {"<", "<"};
  toks[TOK_RANGLE] = {">", ">"};
  toks[TOK_QUESTION] = {"?", "\\?"};
  toks[TOK_EQUAL] = {"=", "="};
  toks[TOK_LSQUARE] = {"[", "\\["};
  toks[TOK_RSQUARE] = {"]", "\\]"};
  toks[TOK_UNDER] = {"_", "_"};
  toks[TOK_OTHER] = {"OtherChar", "[$%\\(\\)\\*\\+,@\\\\\\^`{}\\|~]"};
  return out;
}